

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O3

bool __thiscall BamTools::Internal::HostAddress::operator==(HostAddress *this,HostAddress *other)

{
  NetworkProtocol NVar1;
  NetworkProtocol NVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  
  NVar1 = this->m_protocol;
  NVar2 = other->m_protocol;
  if (NVar1 == IPv6Protocol) {
    if (NVar2 != IPv6Protocol) {
      return false;
    }
    auVar4[0] = -((other->m_ip6Address).data[0] == (this->m_ip6Address).data[0]);
    auVar4[1] = -((other->m_ip6Address).data[1] == (this->m_ip6Address).data[1]);
    auVar4[2] = -((other->m_ip6Address).data[2] == (this->m_ip6Address).data[2]);
    auVar4[3] = -((other->m_ip6Address).data[3] == (this->m_ip6Address).data[3]);
    auVar4[4] = -((other->m_ip6Address).data[4] == (this->m_ip6Address).data[4]);
    auVar4[5] = -((other->m_ip6Address).data[5] == (this->m_ip6Address).data[5]);
    auVar4[6] = -((other->m_ip6Address).data[6] == (this->m_ip6Address).data[6]);
    auVar4[7] = -((other->m_ip6Address).data[7] == (this->m_ip6Address).data[7]);
    auVar4[8] = -((other->m_ip6Address).data[8] == (this->m_ip6Address).data[8]);
    auVar4[9] = -((other->m_ip6Address).data[9] == (this->m_ip6Address).data[9]);
    auVar4[10] = -((other->m_ip6Address).data[10] == (this->m_ip6Address).data[10]);
    auVar4[0xb] = -((other->m_ip6Address).data[0xb] == (this->m_ip6Address).data[0xb]);
    auVar4[0xc] = -((other->m_ip6Address).data[0xc] == (this->m_ip6Address).data[0xc]);
    auVar4[0xd] = -((other->m_ip6Address).data[0xd] == (this->m_ip6Address).data[0xd]);
    auVar4[0xe] = -((other->m_ip6Address).data[0xe] == (this->m_ip6Address).data[0xe]);
    auVar4[0xf] = -((other->m_ip6Address).data[0xf] == (this->m_ip6Address).data[0xf]);
    bVar3 = (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar4[0xf] >> 7) << 0xf) == 0xffff;
  }
  else if (NVar1 == IPv4Protocol) {
    bVar3 = NVar2 == IPv4Protocol && other->m_ip4Address == this->m_ip4Address;
  }
  else {
    bVar3 = NVar1 == NVar2;
  }
  return bVar3;
}

Assistant:

bool HostAddress::operator==(const HostAddress& other) const
{

    // if self is IPv4
    if (m_protocol == HostAddress::IPv4Protocol) {
        return (other.m_protocol == HostAddress::IPv4Protocol &&
                m_ip4Address == other.m_ip4Address);
    }

    // if self is IPv6
    else if (m_protocol == HostAddress::IPv6Protocol) {
        return (other.m_protocol == HostAddress::IPv6Protocol &&
                memcmp(&m_ip6Address, &other.m_ip6Address, sizeof(IPv6Address)) == 0);
    }

    // otherwise compare protocols
    else
        return m_protocol == other.m_protocol;
}